

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O3

int voctok(voccxdef *ctx,char *cmd,char *outbuf,char **wrd,int lower,int cvt_ones,int show_errors)

{
  char cVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  ushort **ppuVar8;
  __int32_t **pp_Var9;
  vocwdef *pvVar10;
  size_t sVar11;
  ushort *puVar12;
  long lVar13;
  byte *pbVar14;
  byte bVar15;
  uint uVar16;
  char *pcVar17;
  byte *pbVar18;
  uint len;
  ulong uVar19;
  char *pcVar20;
  byte *pbVar21;
  uint uVar22;
  char quote;
  byte bVar23;
  ulong uVar24;
  vocspdef *pvVar25;
  char *pcVar26;
  char **local_98;
  uint local_84;
  
  uVar16 = 0;
LAB_001f1605:
  bVar23 = *cmd;
  if (-1 < (char)bVar23) {
    ppuVar8 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar8 + (ulong)bVar23 * 2 + 1) & 0x20) == 0) {
        if (bVar23 == 0) {
          wrd[(int)uVar16] = outbuf;
          *outbuf = 0;
          return uVar16;
        }
        break;
      }
      bVar23 = ((byte *)cmd)[1];
      cmd = (char *)((byte *)cmd + 1);
    } while (-1 < (char)bVar23);
  }
  local_84 = uVar16 + 1;
  wrd[(int)uVar16] = outbuf;
  bVar23 = *cmd;
  uVar24 = (ulong)(char)bVar23;
  if ((((long)uVar24 < 0) || (ppuVar8 = __ctype_b_loc(), bVar23 == 0x2d)) ||
     (((*ppuVar8)[uVar24] & 0x400) != 0)) {
    uVar19 = (ulong)outbuf & 0xffffffff;
    do {
      pbVar18 = (byte *)cmd + 1;
      bVar23 = (byte)uVar24;
      iVar7 = (int)uVar19;
      if (-1 < (char)bVar23) {
        ppuVar8 = __ctype_b_loc();
        uVar24 = uVar24 & 0xff;
        if (((((*ppuVar8)[uVar24] & 0xc00) == 0) && (bVar23 != 0x2d)) && ((int)uVar24 != 0x27))
        goto LAB_001f1772;
        if ((lower != 0) && (((*ppuVar8)[uVar24] & 0x100) != 0)) {
          pp_Var9 = __ctype_tolower_loc();
          bVar23 = *(byte *)(*pp_Var9 + uVar24);
        }
      }
      *outbuf = bVar23;
      outbuf = (char *)((byte *)outbuf + 1);
      uVar24 = (ulong)*pbVar18;
      uVar19 = (ulong)(iVar7 + 1);
      cmd = (char *)pbVar18;
    } while( true );
  }
  pbVar18 = (byte *)outbuf;
  if (((*ppuVar8)[uVar24] >> 0xb & 1) != 0) {
    while ((((bVar23 = (byte)uVar24, (char)bVar23 < '\0' ||
             (((*ppuVar8)[uVar24 & 0xff] & 0xc00) != 0)) || (bVar23 == 0x2d)) ||
           ((int)(uVar24 & 0xff) == 0x27))) {
      *pbVar18 = bVar23;
      pbVar18 = pbVar18 + 1;
      pbVar14 = (byte *)cmd + 1;
      cmd = (char *)((byte *)cmd + 1);
      uVar24 = (ulong)*pbVar14;
    }
    goto LAB_001f1a6c;
  }
  if (0x3f < bVar23) {
LAB_001f1b37:
    if (show_errors != 0) {
      iVar7 = tio_is_html_mode();
      if (iVar7 == 0) {
        vocerr(ctx,1,"I don\'t understand the punctuation \"%c\".",(ulong)(uint)(int)*cmd);
      }
      else {
        outformat("\\H-");
        vocerr(ctx,1,"I don\'t understand the punctuation \"%c\".",(ulong)(uint)(int)*cmd);
        outformat("\\H+");
      }
    }
    return -1;
  }
  uVar24 = (ulong)(uint)bVar23;
  if ((0x8800400200000000U >> (uVar24 & 0x3f) & 1) == 0) {
    if ((0x8400000000U >> (uVar24 & 0x3f) & 1) != 0) {
      *outbuf = 0x22;
      pbVar18 = (byte *)outbuf + 3;
      pbVar14 = (byte *)cmd + 1;
      bVar15 = ((byte *)cmd)[1];
      if (bVar15 != bVar23 && bVar15 != 0) {
        do {
          cmd = (char *)pbVar14;
          if (bVar15 == 0x5c) {
            *pbVar18 = 0x5c;
            pbVar18 = pbVar18 + 1;
          }
          *pbVar18 = bVar15;
          pbVar18 = pbVar18 + 1;
          bVar15 = ((byte *)cmd)[1];
          pbVar14 = (byte *)cmd + 1;
        } while ((bVar15 != 0) && (bVar15 != bVar23));
      }
      *(short *)((byte *)outbuf + 1) = (short)pbVar18 - (short)((byte *)outbuf + 1);
      cmd = (char *)((byte *)cmd + 2);
      if (*pbVar14 != bVar23) {
        cmd = (char *)pbVar14;
      }
      goto LAB_001f1a6c;
    }
    if ((0x400100000000000U >> (uVar24 & 0x3f) & 1) == 0) goto LAB_001f1b37;
    *outbuf = 0x2c;
  }
  else {
    *outbuf = 0x2e;
  }
  pbVar18 = (byte *)outbuf + 1;
  cmd = (char *)((byte *)cmd + 1);
LAB_001f1a6c:
  *pbVar18 = 0;
  outbuf = (char *)(pbVar18 + 1);
  uVar16 = local_84;
  goto LAB_001f1605;
LAB_001f1772:
  pcVar17 = wrd[(int)uVar16];
  uVar22 = iVar7 - (int)pcVar17;
  pbVar14 = (byte *)outbuf;
  pbVar21 = (byte *)cmd;
  len = uVar22;
  if (bVar23 == 0x2e) {
    pbVar14 = (byte *)outbuf + 1;
    ((byte *)outbuf)[0] = 0x2e;
    ((byte *)outbuf)[1] = 0;
    len = (iVar7 - (int)pcVar17) + 1;
    pvVar10 = vocffw(ctx,pcVar17,len,(char *)0x0,0,3,(vocseadef *)0x0);
    pbVar21 = pbVar18;
    if ((pvVar10 == (vocwdef *)0x0) &&
       (pvVar10 = vocffw(ctx,pcVar17,len,(char *)0x0,0,4,(vocseadef *)0x0),
       pvVar10 == (vocwdef *)0x0)) {
      pbVar14 = (byte *)outbuf;
      pbVar21 = (byte *)cmd;
      len = uVar22;
    }
  }
  *pbVar14 = 0;
  iVar7 = ctx->voccxcpl;
  if (iVar7 != 0) {
    puVar12 = (ushort *)ctx->voccxcpp;
    do {
      uVar3 = *puVar12;
      uVar24 = (ulong)uVar3;
      uVar4 = *(ushort *)((long)puVar12 + uVar24);
      lVar13 = uVar4 + uVar24;
      uVar5 = *(ushort *)((long)puVar12 + uVar4 + uVar24);
      if (((0 < (int)uVar16) && (len == uVar4 - 2)) &&
         (iVar6 = bcmp(pcVar17,(void *)((long)puVar12 + uVar24 + 2),(ulong)len), iVar6 == 0)) {
        pcVar20 = wrd[(ulong)local_84 - 2];
        sVar11 = strlen(pcVar20);
        if ((sVar11 == uVar3 - 2) && (iVar6 = bcmp(pcVar20,puVar12 + 1,sVar11), iVar6 == 0)) {
          memcpy(pcVar20,(void *)((long)puVar12 + lVar13 + 2),(ulong)(uVar5 - 2));
          wrd[(ulong)local_84 - 2][(ulong)uVar5 - 2] = '\0';
          local_84 = uVar16;
          break;
        }
      }
      puVar12 = (ushort *)((long)puVar12 + (ulong)uVar5 + lVar13);
      iVar7 = iVar7 - ((uint)uVar3 + (uint)uVar4 + (uint)uVar5);
    } while (iVar7 != 0);
  }
  pcVar17 = ctx->voccxspp;
  lVar13 = (long)(int)local_84;
  if (pcVar17 == (char *)0x0) {
    local_98 = wrd + lVar13 + -1;
    pcVar17 = *local_98;
    pvVar25 = vocsptab;
    pcVar20 = "of";
    do {
      pvVar25 = pvVar25 + 1;
      iVar7 = strncmp(pcVar17,pcVar20,6);
      if (iVar7 == 0) {
        cVar1 = pvVar25[-1].vocspout;
        if (cvt_ones == 0) {
          if (2 < (byte)(cVar1 + 0xb2U)) goto LAB_001f1a33;
        }
        else if (cVar1 != 'O') {
LAB_001f1a33:
          *pcVar17 = cVar1;
          goto LAB_001f1a3f;
        }
      }
      pcVar20 = pvVar25->vocspin;
    } while (pcVar20 != (char *)0x0);
  }
  else {
    pcVar20 = wrd[lVar13 + -1];
    sVar11 = strlen(pcVar20);
    if (0 < (long)ctx->voccxspl) {
      local_98 = wrd + lVar13 + -1;
      pcVar26 = pcVar17 + ctx->voccxspl;
LAB_001f193a:
      cVar1 = pcVar17[1];
      if ((int)cVar1 != (int)sVar11) goto LAB_001f197e;
      cVar2 = *pcVar17;
      iVar7 = bcmp(pcVar17 + 2,pcVar20,(long)cVar1);
      if (iVar7 != 0) goto LAB_001f197e;
      if (cvt_ones == 0) {
        if (0xfc < (byte)(cVar2 + 0xafU)) goto LAB_001f197e;
      }
      else if (cVar2 == 'O') goto LAB_001f197e;
      *pcVar20 = cVar2;
LAB_001f1a3f:
      (*local_98)[1] = '\0';
    }
  }
LAB_001f1a4b:
  pcVar17 = wrd[lVar13 + -1];
  sVar11 = strlen(pcVar17);
  pbVar18 = (byte *)(pcVar17 + sVar11);
  cmd = (char *)pbVar21;
  goto LAB_001f1a6c;
LAB_001f197e:
  pcVar17 = pcVar17 + 2 + cVar1;
  if (pcVar26 <= pcVar17) goto LAB_001f1a4b;
  goto LAB_001f193a;
}

Assistant:

int voctok(voccxdef *ctx, char *cmd, char *outbuf, char **wrd,
           int lower, int cvt_ones, int show_errors)
{
    int       i;
    vocspdef *x;
    int       l;
    char     *p;
    char     *w;
    uint      len;

    for (i = 0 ;; )
    {
        while (vocisspace(*cmd)) cmd++;
        if (!*cmd)
        {
            wrd[i] = outbuf;
            *outbuf = '\0';
            return(i);
        }

        wrd[i++] = outbuf;
        if (vocisalpha(*cmd) || *cmd == '-')
        {
            while(vocisalpha(*cmd) || vocisdigit(*cmd) ||
                  *cmd=='\'' || *cmd=='-')
            {
                *outbuf++ = (vocisupper(*cmd) && lower) ? tolower(*cmd) : *cmd;
                ++cmd;
            }
            
            /*
             *   Check for a special case:  abbreviations that end in a
             *   period.  For example, "Mr. Patrick J. Wayne."  We wish
             *   to absorb the period after "Mr" and the one after "J"
             *   into the respective words; we detect this condition by
             *   actually trying to find a word in the dictionary that
             *   has the period.
             */
            w = wrd[i-1];
            len = outbuf - w;
            if (*cmd == '.')
            {
                *outbuf++ = *cmd++;           /* add the period to the word */
                *outbuf = '\0';                        /* null-terminate it */
                ++len;
                if (!vocffw(ctx, (char *)w, len, 0, 0, PRP_NOUN,
                            (vocseadef *)0)
                    && !vocffw(ctx, (char *)w, len, 0, 0, PRP_ADJ,
                               (vocseadef *)0))
                {
                    /* no word with period in dictionary - remove period */
                    --outbuf;
                    --cmd;
                    --len;
                }
            }

            /* null-terminate the buffer */
            *outbuf = '\0';

            /* find compound words and glue them together */
            for (p = ctx->voccxcpp, l = ctx->voccxcpl ; l ; )
            {
                uint   l1 = osrp2(p);
                char  *p2 = p + l1;                      /* get second word */
                uint   l2 = osrp2(p2);
                char  *p3 = p2 + l2;                   /* get compound word */
                uint   l3 = osrp2(p3);
                
                if (i > 1 && len == (l2 - 2)
                    && !memcmp(w, p2 + 2, (size_t)len)
                    && strlen((char *)wrd[i-2]) == (l1 - 2)
                    && !memcmp(wrd[i-2], p + 2, (size_t)(l1 - 2)))
                {
                    memcpy(wrd[i-2], p3 + 2, (size_t)(l3 - 2));
                    *(wrd[i-2] + l3 - 2) = '\0';
                    --i;
                    break;
                }

                /* move on to the next word */
                l -= l1 + l2 + l3;
                p = p3 + l3;
            }

            /*
             *   Find any special keywords, and set to appropriate flag
             *   char.  Note that we no longer convert "of" in this
             *   fashion; "of" is now handled separately in order to
             *   facilitate its use as an ordinary preposition. 
             */
            if (ctx->voccxspp)
            {
                char  *p;
                char  *endp;
                char   typ;
                int    len;
                int    wrdlen = strlen((char *)wrd[i-1]);
                
                for (p = ctx->voccxspp, endp = p + ctx->voccxspl ;
                     p < endp ; )
                {
                    typ = *p++;
                    len = *p++;
                    if (len == wrdlen && !memcmp(p, wrd[i-1], (size_t)len)
                        && (cvt_ones || (typ != VOCW_ONE && typ != VOCW_ONES))
                        && typ != VOCW_OF)
                    {
                        *wrd[i-1] = typ;
                        *(wrd[i-1] + 1) = '\0';
                        break;
                    }
                    p += len;
                }
            }
            else
            {
                for (x = vocsptab ; x->vocspin ; ++x)
                {
                    if (!strncmp((char *)wrd[i-1], (char *)x->vocspin,
                                 (size_t)6)
                        && (cvt_ones ||
                            (x->vocspout != VOCW_ONE
                             && x->vocspout != VOCW_ONES))
                        && x->vocspout != VOCW_OF)
                    {
                        *wrd[i-1] = x->vocspout;
                        *(wrd[i-1] + 1) = '\0';
                        break;
                    }
                }
            }

            /* make sure the output pointer is fixed up to the right spot */
            outbuf = wrd[i-1];
            outbuf += strlen((char *)outbuf);
        }
        else if (vocisdigit( *cmd ))
        {
            while(vocisdigit(*cmd) || vocisalpha(*cmd)
                  || *cmd == '\'' || *cmd == '-')
                *outbuf++ = *cmd++;
        }
        else switch( *cmd )
        {
        case '.':
        case '!':
        case '?':
        case ';':
            *outbuf++ = VOCW_THEN;
            ++cmd;
            break;

        case ',':
        case ':':
            *outbuf++ = VOCW_AND;
            ++cmd;
            break;

        case '"':
        case '\'':
            {
                char  *lenptr;
                char   quote = *cmd++;

                /* 
                 *   remember that this is a quoted string (it doesn't
                 *   matter whether they're actually using single or
                 *   double quotes - in either case, we use '"' as the
                 *   flag to indicate that it's a quote string)
                 */
                *outbuf++ = '"';

                /* make room for the length prefix */
                lenptr = outbuf;
                outbuf += 2;

                /* copy up to the matching close quote */
                while (*cmd && *cmd != quote)
                {
                    char c;

                    /* get this character */
                    c = *cmd++;
                    
                    /* escape the character if necessary */
                    switch(c)
                    {
                    case '\\':
                        *outbuf++ = '\\';
                        break;
                    }

                    /* copy this character */
                    *outbuf++ = c;
                }
                
                oswp2(lenptr, ((int)(outbuf - lenptr)));
                if (*cmd == quote) cmd++;
                break;
            }

        default:
            /* display an error if appropriate */
            if (show_errors)
            {
                int hmode = tio_is_html_mode();

                /* 
                 *   if we're in HTML mode, switch out momentarily, so that
                 *   we show the character literally, even if it's a
                 *   markup-significant character (such as '<' or '&') 
                 */
                if (hmode)
                    tioputs(ctx->voccxtio, "\\H-");
                
                /* show the message */
                vocerr(ctx, VOCERR(1),
                       "I don't understand the punctuation \"%c\".", *cmd);

                /* restore HTML mode if appropriate */
                if (hmode)
                    tioputs(ctx->voccxtio, "\\H+");
            }

            /* return failure */
            return -1;
        }

        /* null-terminate the result */
        *outbuf++ = '\0';
    }
}